

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelSampleCase::checkTextureState
          (TextureLevelSampleCase *this,CallLogWrapper *gl,TextureGenerationSpec *spec)

{
  pointer pTVar1;
  bool bVar2;
  int level;
  int refValue;
  
  pTVar1 = (spec->levels).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  refValue = 0;
  level = 0;
  if (pTVar1 != (spec->levels).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    level = pTVar1->level;
    refValue = spec->sampleCount;
  }
  bVar2 = verifyTextureLevelParameterGreaterOrEqual
                    (gl,spec->queryTarget,level,0x9106,refValue,
                     (this->super_TextureLevelCommonCase).super_TextureLevelCase.m_type);
  return bVar2;
}

Assistant:

bool checkTextureState (glu::CallLogWrapper& gl, const TextureGenerationSpec& spec)
	{
		const int queryLevel	= (spec.levels.empty()) ? (0) : (spec.levels[0].level);
		const int refValue		= (spec.levels.empty()) ? (0) : (spec.sampleCount);

		return verifyTextureLevelParameterGreaterOrEqual(gl, spec.queryTarget, queryLevel, GL_TEXTURE_SAMPLES, refValue, m_type);
	}